

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O3

void __thiscall Js::JavascriptMap::Set(JavascriptMap *this,Var key,Var value)

{
  bool bVar1;
  Type TVar2;
  ThreadContext *pTVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  
  pTVar3 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr
             )->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  bVar1 = pTVar3->noJsReentrancy;
  pTVar3->noJsReentrancy = true;
  TVar2 = this->kind;
  if (TVar2 == ComplexVarMap) {
    SetOnComplexVarMap(this,key,value);
  }
  else if (TVar2 == SimpleVarMap) {
    bVar5 = TrySetOnSimpleVarMap(this,key,value);
    if (!bVar5) {
      PromoteToComplexVarMap(this);
      Set(this,key,value);
    }
  }
  else if (TVar2 == EmptyMap) {
    SetOnEmptyMap(this,key,value);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                                ,600,"((0))","(0)");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
  }
  pTVar3->noJsReentrancy = bVar1;
  return;
}

Assistant:

void
JavascriptMap::Set(Var key, Var value)
{
    JS_REENTRANCY_LOCK(jsReentLock, this->GetScriptContext()->GetThreadContext());

    switch (this->kind)
    {
    case MapKind::EmptyMap:
        this->SetOnEmptyMap(key, value);
        return;

    case MapKind::SimpleVarMap:
        if (this->TrySetOnSimpleVarMap(key, value))
        {
            return;
        }
        this->PromoteToComplexVarMap();
        return this->Set(key, value);

    case MapKind::ComplexVarMap:
        this->SetOnComplexVarMap(key, value);
        return;

    default:
        Assume(UNREACHED);
    }
}